

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CppGeneratorTest_BasicError_Test::
CppGeneratorTest_BasicError_Test(CppGeneratorTest_BasicError_Test *this)

{
  CppGeneratorTest_BasicError_Test *this_local;
  
  CppGeneratorTest::CppGeneratorTest(&this->super_CppGeneratorTest);
  (this->super_CppGeneratorTest).super_CommandLineInterfaceTester.super_Test._vptr_Test =
       (_func_int **)&PTR__CppGeneratorTest_BasicError_Test_02a01500;
  return;
}

Assistant:

TEST_F(CppGeneratorTest, BasicError) {
  CreateTempFile("foo.proto",
                 R"schema(
    syntax = "proto2";
    message Foo {
      int32 bar = 1;
    })schema");

  RunProtoc(
      "protocol_compiler --proto_path=$tmpdir --cpp_out=$tmpdir foo.proto");

  ExpectErrorSubstring(
      "foo.proto:4:7: Expected \"required\", \"optional\", or \"repeated\"");
}